

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::Canceler::cancel(Canceler *this,StringPtr cancelReason)

{
  StringPtr cancelReason_local;
  Array<char> local_1c0;
  Exception local_1a8;
  
  cancelReason_local.content.size_ = cancelReason.content.size_;
  cancelReason_local.content.ptr = cancelReason.content.ptr;
  if ((this->list).ptr != (AdapterBase *)0x0) {
    str<kj::StringPtr&>((String *)&local_1c0,(kj *)&cancelReason_local,
                        (StringPtr *)cancelReason_local.content.size_);
    Exception::Exception
              (&local_1a8,DISCONNECTED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0xdc,(String *)&local_1c0);
    cancel(this,&local_1a8);
    Exception::~Exception(&local_1a8);
    Array<char>::~Array(&local_1c0);
  }
  return;
}

Assistant:

void Canceler::cancel(StringPtr cancelReason) {
  if (isEmpty()) return;
  // We can't use getDestructionReason() here because if an exception is in-flight, it would use
  // that exception, totally discarding the reason given by the caller. This would probably be
  // unexpected. The caller can always use getDestructionReason() themselves if desired.
  cancel(Exception(Exception::Type::DISCONNECTED, __FILE__, __LINE__, kj::str(cancelReason)));
}